

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

void Seg_ManComputeDelay(Gia_Man_t *pGia,int DelayInit,int nFanouts,int fTwo,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  sat_solver *psVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Seg_Man_t *p;
  int *pVars;
  ulong uVar11;
  Gia_Man_t *pGVar12;
  Vec_Int_t *pVVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  char *__format;
  uint uVar16;
  timespec ts;
  uint local_58;
  timespec local_50;
  long local_40;
  Vec_Int_t *local_38;
  
  iVar6 = clock_gettime(3,&local_50);
  if (iVar6 < 0) {
    local_40 = -1;
  }
  else {
    local_40 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p = Seg_ManAlloc(pGia,nFanouts);
  uVar16 = p->nVars;
  uVar7 = 0x10;
  if (0xe < uVar16 - 1) {
    uVar7 = uVar16;
  }
  if (uVar7 == 0) {
    pVars = (int *)0x0;
  }
  else {
    pVars = (int *)malloc((long)(int)uVar7 << 2);
  }
  if (0 < (int)uVar16) {
    uVar11 = 0;
    do {
      pVars[uVar11] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  local_58 = DelayInit;
  if (DelayInit == 0) {
    local_58 = p->DelayMax;
  }
  if (fVerbose != 0) {
    sat_solver_nvars(p->pSat);
    printf("Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n",
           (ulong)local_58,(ulong)(fTwo + 1));
  }
  Seg_ManCreateCnf(p,fTwo,fVerbose);
  sat_solver_set_resource_limits(p->pSat,0,0,0,0);
  psVar2 = p->pSat;
  psVar2->nRuntimeLimit = 0;
  psVar2->fNotUseRandom = 1;
  piVar3 = p->vPolars->pArray;
  uVar7 = p->vPolars->nSize;
  if (0 < psVar2->size) {
    lVar15 = 0;
    do {
      psVar2->polarity[lVar15] = '\0';
      lVar15 = lVar15 + 1;
    } while (lVar15 < psVar2->size);
  }
  if (0 < (int)uVar7) {
    uVar11 = 0;
    do {
      psVar2->polarity[piVar3[uVar11]] = '\x01';
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  sat_solver_set_var_activity(p->pSat,pVars,uVar16);
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (p->DelayMax < 0) {
    pVVar13 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar13 = (Vec_Int_t *)0x0;
    uVar16 = p->DelayMax;
    do {
      pGVar12 = p->pGia;
      pVVar14 = pGVar12->vCos;
      lVar15 = 0;
      if (0 < pVVar14->nSize) {
        lVar15 = 0;
        do {
          iVar6 = pVVar14->pArray[lVar15];
          if (((long)iVar6 < 0) || (pGVar12->nObjs <= iVar6)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar4 = pGVar12->pObjs;
          pGVar1 = pGVar4 + iVar6 + -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar6) & 0x1fffffff);
          if ((pGVar1 < pGVar4) || (pGVar4 + pGVar12->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar7 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
          if ((((int)uVar7 < 0) || (p->vFirsts->nSize <= (int)uVar7)) ||
             (p->vNvars->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((int)uVar16 < p->vNvars->pArray[uVar7 & 0x7fffffff]) {
            iVar6 = p->vFirsts->pArray[uVar7 & 0x7fffffff] + uVar16;
            if (iVar6 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf1,"int Abc_Var2Lit(int, int)");
            }
            iVar6 = sat_solver_push(p->pSat,iVar6 * 2 + 1);
            if (iVar6 == 0) break;
          }
          lVar15 = lVar15 + 1;
          pGVar12 = p->pGia;
          pVVar14 = pGVar12->vCos;
        } while (lVar15 < pVVar14->nSize);
      }
      if ((int)lVar15 < p->pGia->vCos->nSize) {
        printf("Proved UNSAT for delay %d.  ",(ulong)uVar16);
        iVar8 = 3;
        iVar6 = clock_gettime(3,&local_50);
        if (iVar6 < 0) {
LAB_0074b2f9:
          lVar15 = -1;
        }
        else {
LAB_0074b288:
          lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        lVar15 = lVar15 - local_40;
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",(double)lVar15 / 1000000.0);
        break;
      }
      if ((int)uVar16 <= (int)local_58) {
        local_38 = pVVar13;
        iVar6 = sat_solver_nconflicts(p->pSat);
        iVar8 = sat_solver_solve_internal(p->pSat);
        iVar9 = sat_solver_nconflicts(p->pSat);
        if (iVar8 != 1) {
          pVVar13 = local_38;
          if (fVerbose != 0) {
            __format = "Resource limit reached for delay %d.  ";
            if (iVar8 == -1) {
              __format = "Proved UNSAT for delay %d.  ";
            }
            printf(__format,(ulong)uVar16);
            iVar8 = 3;
            iVar6 = clock_gettime(3,&local_50);
            pVVar13 = local_38;
            if (-1 < iVar6) goto LAB_0074b288;
            goto LAB_0074b2f9;
          }
          break;
        }
        if (fVerbose != 0) {
          if (p->nVars < 1) {
            uVar7 = 0;
          }
          else {
            uVar7 = 0;
            iVar8 = 0;
            do {
              iVar10 = sat_solver_var_value(p->pSat,iVar8);
              uVar7 = uVar7 + iVar10;
              iVar8 = iVar8 + 1;
            } while (iVar8 < p->nVars);
          }
          printf("Solution with delay %2d and %5d edges exists. Conf = %8d.  ",(ulong)uVar16,
                 (ulong)uVar7,(ulong)(uint)(iVar9 - iVar6));
          iVar8 = 3;
          iVar6 = clock_gettime(3,&local_50);
          if (iVar6 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          lVar15 = lVar15 - local_40;
          Abc_Print(iVar8,"%s =","Time");
          Abc_Print(iVar8,"%9.2f sec\n",(double)lVar15 / 1000000.0);
        }
        pVVar13 = local_38;
        if (local_38 != (Vec_Int_t *)0x0) {
          if (local_38->pArray != (int *)0x0) {
            free(local_38->pArray);
            pVVar13->pArray = (int *)0x0;
          }
          free(pVVar13);
        }
        pVVar13 = Seg_ManConvertResult(p);
      }
      bVar5 = 0 < (int)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar5);
  }
  Gia_ManEdgeFromArray(p->pGia,pVVar13);
  if (pVVar13 != (Vec_Int_t *)0x0) {
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (int *)0x0;
    }
    free(pVVar13);
  }
  Seg_ManStop(p);
  return;
}

Assistant:

void Seg_ManComputeDelay( Gia_Man_t * pGia, int DelayInit, int nFanouts, int fTwo, int fVerbose )
{
    int nBTLimit = 0;
    int nTimeOut = 0;
    int fVeryVerbose = 0;

    Gia_Obj_t * pObj;
    abctime clk = Abc_Clock();
    Vec_Int_t * vEdges2 = NULL;
    int i, iLut, iFirst, nVars, status, Delay, nConfs;
    Seg_Man_t * p = Seg_ManAlloc( pGia, nFanouts );
    Vec_Int_t * vVars = Vec_IntStartNatural( p->nVars );
    int DelayStart = DelayInit ? DelayInit : p->DelayMax;

    if ( fVerbose )
    printf( "Running SatEdge with starting delay %d and edge %d (edge vars %d, total vars %d)\n", 
        DelayStart, fTwo+1, p->FirstVar, sat_solver_nvars(p->pSat) );
    Seg_ManCreateCnf( p, fTwo, fVerbose );
    //Sat_SolverWriteDimacs( p->pSat, "test_edge.cnf", NULL, NULL, 0 );
    // set resource limits
    sat_solver_set_resource_limits( p->pSat, nBTLimit, 0, 0, 0 );
    sat_solver_set_runtime_limit( p->pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_set_random( p->pSat, 1 );
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolars), Vec_IntSize(p->vPolars) );
    sat_solver_set_var_activity( p->pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );
    Vec_IntFree( vVars );
    // increment delay gradually
    for ( Delay = p->DelayMax; Delay >= 0; Delay-- )
    {
        // we constrain COs, although it would be fine to constrain only POs
        Gia_ManForEachCoDriver( p->pGia, pObj, i )
        {
            iLut   = Gia_ObjId( p->pGia, pObj );
            iFirst = Vec_IntEntry( p->vFirsts, iLut );
            nVars  = Vec_IntEntry( p->vNvars, iLut );
            if ( Delay < nVars && !sat_solver_push(p->pSat, Abc_Var2Lit(iFirst + Delay, 1)) )
                break;
        }
        if ( i < Gia_ManCoNum(p->pGia) )
        {
            printf( "Proved UNSAT for delay %d.  ", Delay );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            break;
        }
        if ( Delay > DelayStart )
            continue;
        // solve with assumptions
        //clk = Abc_Clock();
        nConfs = sat_solver_nconflicts( p->pSat );
        status = sat_solver_solve_internal( p->pSat );
        nConfs = sat_solver_nconflicts( p->pSat ) - nConfs;
        if ( status == l_True )
        {
            if ( fVerbose )
            {
                int Count = 0;
                for ( i = 0; i < p->nVars; i++ )
                    Count += sat_solver_var_value(p->pSat, i);
                printf( "Solution with delay %2d and %5d edges exists. Conf = %8d.  ", Delay, Count, nConfs );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            // save the result
            Vec_IntFreeP( &vEdges2 );
            vEdges2 = Seg_ManConvertResult( p );
            if ( fVeryVerbose )
            {
                for ( i = 0; i < p->nVars; i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "   " );

                for ( i = p->nVars; i < sat_solver_nvars(p->pSat); i++ )
                    printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
            }
        }
        else
        {
            if ( fVerbose )
            {
                if ( status == l_False )
                    printf( "Proved UNSAT for delay %d.  ", Delay );
                else
                    printf( "Resource limit reached for delay %d.  ", Delay );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            break;
        }
    }
    Gia_ManEdgeFromArray( p->pGia, vEdges2 );
    Vec_IntFreeP( &vEdges2 );
    Seg_ManStop( p );
}